

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::dht_announce_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,dht_announce_alert *this)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  difference_type in_RCX;
  span<const_char> in;
  allocator<char> local_155 [13];
  aux *local_148;
  char *local_140;
  string local_138;
  string local_118;
  char local_f8 [8];
  char msg [200];
  undefined1 local_28 [8];
  error_code ec;
  dht_announce_alert *this_local;
  
  ec.cat_ = (error_category *)this;
  boost::system::error_code::error_code((error_code *)local_28);
  boost::asio::ip::address::to_string_abi_cxx11_
            (&local_118,&(this->ip).super_address,(error_code *)local_28);
  uVar2 = std::__cxx11::string::c_str();
  uVar1 = this->port;
  span<char_const>::span<libtorrent::digest32<160l>,char,void>
            ((span<char_const> *)&local_148,&this->info_hash);
  in.m_len = in_RCX;
  in.m_ptr = local_140;
  libtorrent::aux::to_hex_abi_cxx11_(&local_138,local_148,in);
  uVar3 = std::__cxx11::string::c_str();
  snprintf(local_f8,200,"incoming dht announce: %s:%d (%s)",uVar2,(ulong)uVar1,uVar3);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_f8,local_155);
  std::allocator<char>::~allocator(local_155);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_announce_alert::message() const
	{
		error_code ec;
		char msg[200];
		std::snprintf(msg, sizeof(msg), "incoming dht announce: %s:%d (%s)"
			, ip.to_string(ec).c_str(), port, aux::to_hex(info_hash).c_str());
		return msg;
	}